

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationSetOption(HelicsPublication pub,int option,int value,HelicsError *err)

{
  PublicationObject *pPVar1;
  uint in_EDX;
  uint in_ESI;
  PublicationObject *pubObj;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsPublication in_stack_ffffffffffffffd8;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pPVar1 != (PublicationObject *)0x0) {
    (*(pPVar1->pubPtr->super_Interface)._vptr_Interface[2])
              (pPVar1->pubPtr,(ulong)in_ESI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void helicsPublicationSetOption(HelicsPublication pub, int option, int value, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}